

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FuncInfo.cpp
# Opt level: O3

uint __thiscall FuncInfo::FindOrAddReferencedPropertyId(FuncInfo *this,PropertyId propertyId)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  undefined8 in_RAX;
  undefined4 *puVar4;
  PropertyId local_28;
  uint local_24;
  PropertyId propertyId_local;
  uint index;
  
  local_24 = (uint)((ulong)in_RAX >> 0x20);
  _local_28 = CONCAT44(local_24,propertyId);
  if (propertyId == -1) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/FuncInfo.cpp"
                       ,200,"(propertyId != Js::Constants::NoProperty)",
                       "propertyId != Js::Constants::NoProperty");
    if (!bVar2) goto LAB_0089ea62;
    *puVar4 = 0;
  }
  if (this->referencedPropertyIdToMapIndex == (ReferencedPropertyIdMap *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/FuncInfo.cpp"
                       ,0xc9,"(referencedPropertyIdToMapIndex != nullptr)",
                       "referencedPropertyIdToMapIndex != nullptr");
    if (!bVar2) {
LAB_0089ea62:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  if (0x2d8 < propertyId) {
    bVar2 = JsUtil::
            BaseDictionary<int,_unsigned_int,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
            ::TryGetValue<int>(this->referencedPropertyIdToMapIndex,&local_28,&local_24);
    if (!bVar2) {
      uVar3 = NewReferencedPropertyId(this);
      _local_28 = CONCAT44(uVar3,local_28);
      JsUtil::
      BaseDictionary<int,unsigned_int,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
      ::
      Insert<(JsUtil::BaseDictionary<int,unsigned_int,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)0>
                ((BaseDictionary<int,unsigned_int,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                  *)this->referencedPropertyIdToMapIndex,&local_28,&local_24);
    }
    propertyId = local_24 + 0x2d9;
  }
  return propertyId;
}

Assistant:

uint FuncInfo::FindOrAddReferencedPropertyId(Js::PropertyId propertyId)
{
    Assert(propertyId != Js::Constants::NoProperty);
    Assert(referencedPropertyIdToMapIndex != nullptr);
    if (propertyId < TotalNumberOfBuiltInProperties)
    {
        return propertyId;
    }
    uint index;
    if (!referencedPropertyIdToMapIndex->TryGetValue(propertyId, &index))
    {
        index = this->NewReferencedPropertyId();
        referencedPropertyIdToMapIndex->Add(propertyId, index);
    }
    return index + TotalNumberOfBuiltInProperties;
}